

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O1

int num_length(uint number)

{
  bool bVar1;
  uint count;
  int iVar2;
  
  if (number != 0) {
    iVar2 = 1;
    do {
      iVar2 = iVar2 + 1;
      bVar1 = 9 < number;
      number = number / 10;
    } while (bVar1);
    return iVar2;
  }
  return 2;
}

Assistant:

int
num_length(unsigned number)
{
  if (number) {
    unsigned count = 1;
    while (number > 0) {
      number /= 10;
      ++count;
    }
    return count;
  } else
    return 2;
}